

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate_LS.h
# Opt level: O2

void __thiscall fanuc_post_processor::generate_LS::left_command(generate_LS *this)

{
  ulong uVar1;
  pointer paVar2;
  pointer paVar3;
  ulong uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  string local_170;
  string local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  paVar2 = (this->pos_).
           super__Vector_base<std::array<double,_7UL>,_std::allocator<std::array<double,_7UL>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  paVar3 = (this->pos_).
           super__Vector_base<std::array<double,_7UL>,_std::allocator<std::array<double,_7UL>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  this->line_cnt = (int)(((long)paVar2 - (long)paVar3) / -0x38) + this->line_cnt + 2;
  uVar4 = 0;
  while( true ) {
    uVar1 = ((long)paVar2 - (long)paVar3) / 0x38;
    if (uVar1 <= uVar4) break;
    std::__cxx11::to_string(&local_150,(int)uVar4 + this->line_cnt + 1);
    std::operator+(&local_130,"\t",&local_150);
    std::operator+(&local_110,&local_130,":L");
    std::operator+(&local_190,&local_110," P[");
    uVar4 = uVar4 + 1;
    std::__cxx11::to_string(&local_170,(int)uVar4);
    std::operator+(&local_90,&local_190,&local_170);
    std::operator+(&local_f0,&local_90,"] ");
    std::operator+(&local_d0,&local_f0,&this->velocity_);
    std::operator+(&local_70,&local_d0,"mm/sec ");
    std::operator+(&local_b0,&local_70,&this->cnt_);
    std::operator+(&local_50,&local_b0,";\n");
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_190);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_150);
    paVar3 = (this->pos_).
             super__Vector_base<std::array<double,_7UL>,_std::allocator<std::array<double,_7UL>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    paVar2 = (this->pos_).
             super__Vector_base<std::array<double,_7UL>,_std::allocator<std::array<double,_7UL>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  }
  this->line_cnt = this->line_cnt + (int)uVar1;
  return;
}

Assistant:

void generate_LS::left_command() {
        line_cnt = line_cnt - pos_.size() + 2;
        for(int i = 0; i < pos_.size(); i++){
            program.append("\t"+std::to_string(i+line_cnt+1)+":L"+" P["+std::to_string(i+1)+"] "+velocity_+"mm/sec "+cnt_+";\n");

        }
        line_cnt += pos_.size();
    }